

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtest.c
# Opt level: O1

int main(void)

{
  int n;
  PmError PVar1;
  int iVar2;
  int iVar3;
  PmQueue *q;
  long *msg2_00;
  int j;
  ulong uVar4;
  ulong uVar5;
  int j_2;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  long msg [100];
  long msg2 [100];
  ulong local_678 [100];
  long local_358 [101];
  
  iVar9 = 0;
  uVar5 = 4;
LAB_00102707:
  n = (int)uVar5;
  q = Pm_QueueCreate(100,n * 8);
  printf("msg_len = %d\n",uVar5 & 0xffffffff);
  if (q != (PmQueue *)0x0) {
    puts("test 1");
    uVar8 = 0;
    do {
      uVar4 = 0;
      do {
        local_678[uVar4] = uVar8 % (ulong)((int)uVar4 + 5);
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
      PVar1 = Pm_Enqueue(q,local_678);
      if (PVar1 != pmNoData) {
        pcVar6 = "Pm_Enqueue error";
        goto LAB_00102896;
      }
      PVar1 = Pm_Dequeue(q,local_358);
      if (PVar1 != pmGotData) {
        pcVar6 = "Pm_Dequeue error";
        goto LAB_00102896;
      }
      iVar2 = cmp_msg((long *)local_678,local_358,n,(int)uVar8);
      if (iVar2 == 0) goto LAB_001028b1;
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
    } while (uVar7 != 0x54d);
    puts("test 2");
    uVar8 = 0;
    do {
      uVar4 = 0;
      do {
        local_678[uVar4] = uVar8 % (ulong)((int)uVar4 + 5);
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
      PVar1 = Pm_Enqueue(q,local_678);
      if (PVar1 != pmNoData) goto LAB_001028a5;
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
    } while (uVar7 != 100);
    uVar8 = 100;
    do {
      iVar2 = (int)uVar8;
      uVar4 = 0;
      do {
        local_678[uVar4] = (long)(int)((iVar2 - 100U) % ((int)uVar4 + 5U));
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
      PVar1 = Pm_Dequeue(q,local_358);
      if (PVar1 != pmGotData) goto LAB_00102abe;
      iVar3 = cmp_msg((long *)local_678,local_358,n,iVar2);
      if (iVar3 == 0) goto LAB_001028b1;
      uVar4 = 0;
      do {
        local_678[uVar4] = uVar8 % (ulong)((int)uVar4 + 5);
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
      PVar1 = Pm_Enqueue(q,local_678);
      if (PVar1 != pmNoData) goto LAB_001028a5;
      uVar8 = (ulong)(iVar2 + 1U);
    } while (iVar2 + 1U != 0x4d2);
    iVar2 = Pm_QueueEmpty(q);
    if (iVar2 == 0) {
      iVar2 = 0x4d2;
      do {
        uVar8 = 0;
        do {
          local_678[uVar8] = (long)(int)((iVar2 - 100U) % ((int)uVar8 + 5U));
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
        PVar1 = Pm_Dequeue(q,local_358);
        if (PVar1 != pmGotData) goto LAB_00102abe;
        iVar3 = cmp_msg((long *)local_678,local_358,n,iVar2);
        if (iVar3 == 0) goto LAB_001028b1;
        iVar2 = iVar2 + 1;
        iVar3 = Pm_QueueEmpty(q);
      } while (iVar3 == 0);
      if (iVar2 != 0x536) goto LAB_00102874;
      puts("test 3");
      uVar7 = 0;
      do {
        uVar8 = 0;
        do {
          local_678[uVar8] = (ulong)uVar7 % (ulong)((int)uVar8 + 5);
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
        PVar1 = Pm_Enqueue(q,local_678);
      } while ((PVar1 != pmBufferOverflow) && (bVar10 = uVar7 < 0x6d, uVar7 = uVar7 + 1, bVar10));
      uVar8 = 0;
      do {
        uVar4 = 0;
        do {
          local_678[uVar4] = uVar8 % (ulong)((int)uVar4 + 5);
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
        PVar1 = Pm_Dequeue(q,local_358);
        if (PVar1 != pmGotData) goto LAB_00102abe;
        iVar2 = cmp_msg((long *)local_678,local_358,n,(int)uVar8);
        if (iVar2 == 0) goto LAB_001028b1;
        uVar7 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar7;
      } while (uVar7 != 100);
      PVar1 = Pm_Dequeue(q,local_358);
      if (PVar1 == pmBufferOverflow) {
        puts("test 4");
        uVar8 = 0;
        do {
          uVar4 = 0;
          do {
            iVar2 = (int)uVar8;
            local_678[uVar4] = uVar8 % (ulong)((int)uVar4 + 5);
            uVar4 = uVar4 + 1;
          } while (uVar5 != uVar4);
          PVar1 = Pm_Enqueue(q,local_678);
          if (PVar1 == pmNoData) {
            msg2_00 = (long *)Pm_QueuePeek(q);
            iVar3 = cmp_msg((long *)local_678,msg2_00,n,iVar2);
            if (iVar3 != 0) {
              PVar1 = Pm_Dequeue(q,local_358);
              if (PVar1 == pmGotData) {
                iVar3 = cmp_msg((long *)local_678,local_358,n,iVar2);
                bVar10 = iVar3 != 0;
                if (!bVar10) {
                  iVar9 = 1;
                }
                goto LAB_00102a97;
              }
              puts("Pm_Dequeue error");
            }
            bVar10 = false;
            iVar9 = 1;
          }
          else {
            puts("Pm_Enqueue error");
            iVar9 = 1;
            bVar10 = false;
          }
LAB_00102a97:
          if (!bVar10) goto LAB_001028a1;
          uVar8 = (ulong)(iVar2 + 1U);
        } while (iVar2 + 1U != 0x54d);
        Pm_QueueDestroy(q);
        bVar10 = true;
        goto LAB_001028b9;
      }
      pcVar6 = "Pm_Dequeue overflow expected";
    }
    else {
LAB_00102874:
      pcVar6 = "Message count error";
    }
    goto LAB_001028ac;
  }
  pcVar6 = "Could not allocate queue";
LAB_00102896:
  puts(pcVar6);
  iVar9 = 1;
LAB_001028a1:
  bVar10 = false;
  goto LAB_001028b9;
LAB_001028a5:
  pcVar6 = "Pm_Enqueue error";
  goto LAB_001028ac;
LAB_00102abe:
  pcVar6 = "Pm_Dequeue error";
LAB_001028ac:
  puts(pcVar6);
LAB_001028b1:
  bVar10 = false;
  iVar9 = 1;
LAB_001028b9:
  if (!bVar10) {
    return iVar9;
  }
  bVar10 = 0x5e < uVar5;
  uVar5 = uVar5 + 5;
  if (bVar10) {
    return 0;
  }
  goto LAB_00102707;
}

Assistant:

int main()
{
    int msg_len;
    for (msg_len = 4; msg_len < 100; msg_len += 5) {
        PmQueue *queue = Pm_QueueCreate(100, msg_len * sizeof(long));
        int i;
        long msg[100];
        long msg2[100];

	printf("msg_len = %d\n", msg_len);
        if (!queue) {
            printf("Could not allocate queue\n");
            return 1;
        }
    
        /* insert/remove 1000 messages */
        printf("test 1\n");
        for (i = 0; i < 1357; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
                return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
        }
    
        /* make full */
        printf("test 2\n");
        for (i = 0; i < 100; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
        }
    
        /* alternately remove and insert */
        for (i = 100; i < 1234; i++) {
            make_msg(msg, msg_len, i - 100); /* what we expect */
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
                return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
        }
    
        /* remove all */
        while (!Pm_QueueEmpty(queue)) {
            make_msg(msg, msg_len, i - 100); /* what we expect */
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
                return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
            i++;
        }
        if (i != 1334) {
            printf("Message count error\n");
	    return 1;
        }
    
        /* now test overflow */
        printf("test 3\n");
        for (i = 0; i < 110; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg) == pmBufferOverflow) {
	        break; /* this is supposed to execute after 100 messages */
            }
        }
        for (i = 0; i < 100; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
		return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
        }
	/* we should detect overflow after removing 100 messages */
        if (Pm_Dequeue(queue, msg2) != pmBufferOverflow) {
            printf("Pm_Dequeue overflow expected\n");
	    return 1;
        }
    
	/* after overflow is detected (and cleared), sender can
	 * send again
	 */
        /* see if function is restored, also test peek */
        printf("test 4\n");
        for (i = 0; i < 1357; i++) {
            long *peek;
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
            peek = (long *) Pm_QueuePeek(queue);
            if (!cmp_msg(msg, peek, msg_len, i)) {
	        return 1;
            }
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
	        return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
	        return 1;
            }
        }
        Pm_QueueDestroy(queue);
    }
    return 0;
}